

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O2

uint __thiscall bhf::Commandline::Pop<unsigned_int>(Commandline *this,string *errorMessage)

{
  char **ppcVar1;
  uint uVar2;
  allocator local_29;
  string local_28;
  
  if (this->argc == 0) {
    uVar2 = 0;
    if (errorMessage->_M_string_length != 0) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->usage,errorMessage);
    }
  }
  else {
    this->argc = this->argc + -1;
    ppcVar1 = this->argv;
    this->argv = ppcVar1 + 1;
    std::__cxx11::string::string((string *)&local_28,*ppcVar1,&local_29);
    uVar2 = StringTo<unsigned_int>(&local_28,0);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return uVar2;
}

Assistant:

T Pop(const std::string& errorMessage = {})
    {
        if (argc) {
            --argc;
            return StringTo<T>(*(argv++));
        }
        if (!errorMessage.empty()) {
            usage(errorMessage);
        }
        return T {};
    }